

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_encode_utils.cpp
# Opt level: O2

string * encode_compute_hmac_sha1
                   (string *__return_storage_ptr__,string *access_key,char *buf_in,int len_buf_in)

{
  mbedtls_md_info_t *md_info;
  allocator<char> local_281;
  size_t output_len;
  char output [20];
  mbedtls_md_context_t ctx;
  char encoded [512];
  
  ctx.md_info = (mbedtls_md_info_t *)0x0;
  ctx.md_ctx = (void *)0x0;
  ctx.hmac_ctx = (void *)0x0;
  md_info = mbedtls_md_info_from_type(MBEDTLS_MD_SHA1);
  mbedtls_md_init_ctx(&ctx,md_info);
  output[0] = '\0';
  output[1] = '\0';
  output[2] = '\0';
  output[3] = '\0';
  output[4] = '\0';
  output[5] = '\0';
  output[6] = '\0';
  output[7] = '\0';
  output[8] = '\0';
  output[9] = '\0';
  output[10] = '\0';
  output[0xb] = '\0';
  output[0xc] = '\0';
  output[0xd] = '\0';
  output[0xe] = '\0';
  output[0xf] = '\0';
  output[0x10] = '\0';
  output[0x11] = '\0';
  output[0x12] = '\0';
  output[0x13] = '\0';
  memset(encoded,0,0x200);
  mbedtls_md_hmac_starts(&ctx,(uchar *)(access_key->_M_dataplus)._M_p,access_key->_M_string_length);
  mbedtls_md_hmac_update(&ctx,(uchar *)buf_in,(long)len_buf_in);
  mbedtls_md_hmac_finish(&ctx,(uchar *)output);
  output_len = 0;
  mbedtls_base64_encode((uchar *)encoded,0x200,&output_len,(uchar *)output,0x14);
  mbedtls_md_free(&ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,encoded,&local_281);
  return __return_storage_ptr__;
}

Assistant:

std::string encode_compute_hmac_sha1(std::string access_key, char* buf_in, int len_buf_in) {
  int res = 0;

  mbedtls_md_context_t ctx= {};
  const mbedtls_md_info_t * sha1_md = mbedtls_md_info_from_type(MBEDTLS_MD_SHA1);
  mbedtls_md_init_ctx(&ctx, sha1_md);
  char output[20] = {};
  char encoded[512] = {};
  
  res = mbedtls_md_hmac_starts(&ctx, (const unsigned char*)access_key.c_str(), access_key.size());
  res = mbedtls_md_hmac_update(&ctx, (const unsigned char*)buf_in, len_buf_in);
  res = mbedtls_md_hmac_finish(&ctx, (unsigned char*)output);

  size_t output_len = 0;
  mbedtls_base64_encode((unsigned char*)encoded, sizeof(encoded), &output_len, (const unsigned char*)output, 20);
  mbedtls_md_free(&ctx);
  return encoded;
}